

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc_dplx_msg.c
# Opt level: O0

_Bool xdr_reply_encode(XDR *xdrs,rpc_msg *dmsg)

{
  reply_stat rVar1;
  _Bool _Var2;
  accept_stat aVar3;
  uint uVar4;
  uint32_t uVar5;
  anon_union_432_2_d8689e7e_for_ru *paVar6;
  uint32_t *puVar7;
  rejected_reply *rr;
  accepted_reply *ar;
  int32_t *buf;
  opaque_auth *oa;
  rpc_msg *dmsg_local;
  XDR *xdrs_local;
  
  rVar1 = (dmsg->ru).RM_rmb.rp_stat;
  if (rVar1 == MSG_ACCEPTED) {
    paVar6 = &(dmsg->ru).RM_rmb.ru;
    if ((dmsg->ru).RM_rmb.ru.RP_ar.ar_verf.oa_length < 0x191) {
      puVar7 = (uint32_t *)
               xdr_inline_encode(xdrs,(ulong)(((dmsg->ru).RM_rmb.ru.RP_ar.ar_verf.oa_length + 3 &
                                              0xfffffffc) + 0x18));
      if (puVar7 == (uint32_t *)0x0) {
        if ((__ntirpc_pkg_params.debug_flags & 0x2000000) != 0) {
          (*__ntirpc_pkg_params.warnx_)("%s:%u ACCEPTED non-INLINE","xdr_reply_encode",0x94);
        }
        _Var2 = xdr_putuint32(xdrs,dmsg->rm_xid);
        if (_Var2) {
          _Var2 = xdr_putenum(xdrs,dmsg->rm_direction);
          if (_Var2) {
            uVar4 = xdr_union((XDR *)xdrs,(enum_t *)&(dmsg->ru).RM_rmb,(char *)&(dmsg->ru).RM_rmb.ru
                              ,(xdr_discrim *)reply_dscrm,(xdrproc_t)0x0);
            if ((uVar4 & 1) == 0) {
              if ((__ntirpc_pkg_params.debug_flags & 1) != 0) {
                (*__ntirpc_pkg_params.warnx_)
                          ("%s:%u ERROR inline_xdr_union","xdr_reply_encode",0xa9);
              }
              xdrs_local._7_1_ = false;
            }
            else {
              xdrs_local._7_1_ = true;
            }
          }
          else {
            if ((__ntirpc_pkg_params.debug_flags & 1) != 0) {
              (*__ntirpc_pkg_params.warnx_)
                        ("%s:%u ERROR rm_direction %u","xdr_reply_encode",0x9f,
                         (ulong)dmsg->rm_direction);
            }
            xdrs_local._7_1_ = false;
          }
        }
        else {
          if ((__ntirpc_pkg_params.debug_flags & 1) != 0) {
            (*__ntirpc_pkg_params.warnx_)
                      ("%s:%u ERROR rm_xid %u","xdr_reply_encode",0x98,(ulong)dmsg->rm_xid);
          }
          xdrs_local._7_1_ = false;
        }
      }
      else {
        if ((__ntirpc_pkg_params.debug_flags & 0x2000000) != 0) {
          (*__ntirpc_pkg_params.warnx_)("%s:%u ACCEPTED INLINE","xdr_reply_encode",0x5d);
        }
        uVar5 = htonl(dmsg->rm_xid);
        *puVar7 = uVar5;
        uVar5 = htonl(dmsg->rm_direction);
        puVar7[1] = uVar5;
        uVar5 = htonl((dmsg->ru).RM_rmb.rp_stat);
        puVar7[2] = uVar5;
        uVar5 = htonl((dmsg->ru).RM_rmb.ru.RP_ar.ar_verf.oa_flavor);
        puVar7[3] = uVar5;
        uVar5 = htonl((dmsg->ru).RM_rmb.ru.RP_ar.ar_verf.oa_length);
        ar = (accepted_reply *)(puVar7 + 5);
        puVar7[4] = uVar5;
        if ((dmsg->ru).RM_rmb.ru.RP_ar.ar_verf.oa_length != 0) {
          memcpy(ar,(void *)((long)&(dmsg->ru).RM_rmb.ru + 0x20),
                 (ulong)(dmsg->ru).RM_rmb.ru.RP_ar.ar_verf.oa_length);
          ar = (accepted_reply *)
               ((ar->ar_verf).oa_body +
               (ulong)((dmsg->ru).RM_rmb.ru.RP_ar.ar_verf.oa_length + 3 >> 2) * 4 + -0x20);
        }
        aVar3 = htonl((paVar6->RP_ar).ar_stat);
        ar->ar_stat = aVar3;
        switch((paVar6->RP_ar).ar_stat) {
        case SUCCESS:
          if ((__ntirpc_pkg_params.debug_flags & 0x2000000) != 0) {
            (*__ntirpc_pkg_params.warnx_)("%s:%u SUCCESS","xdr_reply_encode",0x6d);
          }
          xdrs_local._7_1_ = true;
          break;
        case PROG_MISMATCH:
          if ((__ntirpc_pkg_params.debug_flags & 0x2000000) != 0) {
            (*__ntirpc_pkg_params.warnx_)("%s:%u MISMATCH","xdr_reply_encode",0x73);
          }
          puVar7 = (uint32_t *)xdr_inline_encode(xdrs,8);
          if (puVar7 == (uint32_t *)0x0) {
            _Var2 = xdr_putuint32(xdrs,*(uint32_t *)((long)&(dmsg->ru).RM_rmb.ru + 8));
            if (!_Var2) {
              if ((__ntirpc_pkg_params.debug_flags & 1) != 0) {
                (*__ntirpc_pkg_params.warnx_)
                          ("%s:%u ERROR ar_vers.low %u","xdr_reply_encode",0x7d,
                           (ulong)*(uint *)((long)&(dmsg->ru).RM_rmb.ru + 8));
              }
              return false;
            }
            _Var2 = xdr_putuint32(xdrs,*(uint32_t *)((long)&(dmsg->ru).RM_rmb.ru + 0xc));
            if (!_Var2) {
              if ((__ntirpc_pkg_params.debug_flags & 1) != 0) {
                (*__ntirpc_pkg_params.warnx_)
                          ("%s:%u ERROR ar_vers.high %u","xdr_reply_encode",0x84,
                           (ulong)*(uint *)((long)&(dmsg->ru).RM_rmb.ru + 0xc));
              }
              return false;
            }
          }
          else {
            uVar5 = htonl(*(uint32_t *)((long)&(dmsg->ru).RM_rmb.ru + 8));
            *puVar7 = uVar5;
            uVar5 = htonl(*(uint32_t *)((long)&(dmsg->ru).RM_rmb.ru + 0xc));
            puVar7[1] = uVar5;
          }
        case PROG_UNAVAIL:
        case PROC_UNAVAIL:
        case GARBAGE_ARGS:
        case SYSTEM_ERR:
        default:
          xdrs_local._7_1_ = true;
        }
      }
    }
    else {
      if ((__ntirpc_pkg_params.debug_flags & 1) != 0) {
        (*__ntirpc_pkg_params.warnx_)
                  ("%s:%u ERROR ar_verf.oa_length (%u) > %u","xdr_reply_encode",0x52,
                   (ulong)(dmsg->ru).RM_rmb.ru.RP_ar.ar_verf.oa_length,400);
      }
      xdrs_local._7_1_ = false;
    }
  }
  else {
    if (rVar1 == MSG_DENIED) {
      paVar6 = &(dmsg->ru).RM_rmb.ru;
      puVar7 = (uint32_t *)xdr_inline_encode(xdrs,0xc);
      if (puVar7 == (uint32_t *)0x0) {
        _Var2 = xdr_putuint32(xdrs,dmsg->rm_xid);
        if (!_Var2) {
          if ((__ntirpc_pkg_params.debug_flags & 1) != 0) {
            (*__ntirpc_pkg_params.warnx_)
                      ("%s:%u ERROR rm_xid %u","xdr_reply_encode",0xbb,(ulong)dmsg->rm_xid);
          }
          return false;
        }
        _Var2 = xdr_putenum(xdrs,dmsg->rm_direction);
        if (!_Var2) {
          if ((__ntirpc_pkg_params.debug_flags & 1) != 0) {
            (*__ntirpc_pkg_params.warnx_)
                      ("%s:%u ERROR rm_direction %u","xdr_reply_encode",0xc1,
                       (ulong)dmsg->rm_direction);
          }
          return false;
        }
        _Var2 = xdr_putenum(xdrs,(dmsg->ru).RM_rmb.rp_stat);
        if (!_Var2) {
          if ((__ntirpc_pkg_params.debug_flags & 1) != 0) {
            (*__ntirpc_pkg_params.warnx_)
                      ("%s:%u ERROR rp_stat %u","xdr_reply_encode",199,
                       (ulong)(dmsg->ru).RM_rmb.rp_stat);
          }
          return false;
        }
      }
      else {
        uVar5 = htonl(dmsg->rm_xid);
        *puVar7 = uVar5;
        uVar5 = htonl(dmsg->rm_direction);
        puVar7[1] = uVar5;
        uVar5 = htonl((dmsg->ru).RM_rmb.rp_stat);
        puVar7[2] = uVar5;
      }
      if ((paVar6->RP_ar).ar_stat == SUCCESS) {
        if ((__ntirpc_pkg_params.debug_flags & 0x2000000) != 0) {
          (*__ntirpc_pkg_params.warnx_)("%s:%u DENIED MISMATCH","xdr_reply_encode",0xd0);
        }
        puVar7 = (uint32_t *)xdr_inline_encode(xdrs,0xc);
        if (puVar7 == (uint32_t *)0x0) {
          _Var2 = xdr_putenum(xdrs,(paVar6->RP_ar).ar_stat);
          if (!_Var2) {
            if ((__ntirpc_pkg_params.debug_flags & 1) != 0) {
              (*__ntirpc_pkg_params.warnx_)
                        ("%s:%u ERROR rj_stat %u","xdr_reply_encode",0xda,
                         (ulong)(paVar6->RP_ar).ar_stat);
            }
            return false;
          }
          _Var2 = xdr_putuint32(xdrs,*(uint32_t *)((long)&(dmsg->ru).RM_rmb.ru + 4));
          if (!_Var2) {
            if ((__ntirpc_pkg_params.debug_flags & 1) != 0) {
              (*__ntirpc_pkg_params.warnx_)
                        ("%s:%u ERROR rj_vers.low %u","xdr_reply_encode",0xe0,
                         (ulong)*(uint *)((long)&(dmsg->ru).RM_rmb.ru + 4));
            }
            return false;
          }
          _Var2 = xdr_putuint32(xdrs,*(uint32_t *)((long)&(dmsg->ru).RM_rmb.ru + 8));
          if (!_Var2) {
            if ((__ntirpc_pkg_params.debug_flags & 1) != 0) {
              (*__ntirpc_pkg_params.warnx_)
                        ("%s:%u ERROR rj_vers.high %u","xdr_reply_encode",0xe6,
                         (ulong)*(uint *)((long)&(dmsg->ru).RM_rmb.ru + 8));
            }
            return false;
          }
        }
        else {
          uVar5 = htonl((paVar6->RP_ar).ar_stat);
          *puVar7 = uVar5;
          uVar5 = htonl(*(uint32_t *)((long)&(dmsg->ru).RM_rmb.ru + 4));
          puVar7[1] = uVar5;
          uVar5 = htonl(*(uint32_t *)((long)&(dmsg->ru).RM_rmb.ru + 8));
          puVar7[2] = uVar5;
        }
        return true;
      }
      if ((paVar6->RP_ar).ar_stat == PROG_UNAVAIL) {
        if ((__ntirpc_pkg_params.debug_flags & 0x2000000) != 0) {
          (*__ntirpc_pkg_params.warnx_)("%s:%u DENIED AUTH","xdr_reply_encode",0xee);
        }
        puVar7 = (uint32_t *)xdr_inline_encode(xdrs,8);
        if (puVar7 == (uint32_t *)0x0) {
          _Var2 = xdr_putenum(xdrs,(paVar6->RP_ar).ar_stat);
          if (!_Var2) {
            if ((__ntirpc_pkg_params.debug_flags & 1) != 0) {
              (*__ntirpc_pkg_params.warnx_)
                        ("%s:%u ERROR rj_stat %u","xdr_reply_encode",0xf7,
                         (ulong)(paVar6->RP_ar).ar_stat);
            }
            return false;
          }
          _Var2 = xdr_putenum(xdrs,*(enum_t *)((long)&(dmsg->ru).RM_rmb.ru + 4));
          if (!_Var2) {
            if ((__ntirpc_pkg_params.debug_flags & 1) != 0) {
              (*__ntirpc_pkg_params.warnx_)
                        ("%s:%u ERROR rj_why %u","xdr_reply_encode",0xfd,
                         (ulong)*(uint *)((long)&(dmsg->ru).RM_rmb.ru + 4));
            }
            return false;
          }
        }
        else {
          uVar5 = htonl((paVar6->RP_ar).ar_stat);
          *puVar7 = uVar5;
          uVar5 = htonl(*(uint32_t *)((long)&(dmsg->ru).RM_rmb.ru + 4));
          puVar7[1] = uVar5;
        }
        return true;
      }
      if ((__ntirpc_pkg_params.debug_flags & 1) != 0) {
        (*__ntirpc_pkg_params.warnx_)
                  ("%s:%u ERROR rr->rj_stat (%u)","xdr_reply_encode",0x105,
                   (ulong)(paVar6->RP_ar).ar_stat);
      }
    }
    else if ((__ntirpc_pkg_params.debug_flags & 1) != 0) {
      (*__ntirpc_pkg_params.warnx_)
                ("%s:%u ERROR dmsg->rm_reply.rp_stat (%u)","xdr_reply_encode",0x10e,
                 (ulong)(dmsg->ru).RM_rmb.rp_stat);
    }
    xdrs_local._7_1_ = false;
  }
  return xdrs_local._7_1_;
}

Assistant:

bool
xdr_reply_encode(XDR *xdrs, struct rpc_msg *dmsg)
{
	struct opaque_auth *oa;
	int32_t *buf;

	switch (dmsg->rm_reply.rp_stat) {
	case MSG_ACCEPTED:
	{
		struct accepted_reply *ar = (struct accepted_reply *)
						&(dmsg->rm_reply.ru);

		oa = &ar->ar_verf;
		if (oa->oa_length > MAX_AUTH_BYTES) {
			__warnx(TIRPC_DEBUG_FLAG_ERROR,
				"%s:%u ERROR ar_verf.oa_length (%u) > %u",
				__func__, __LINE__,
				oa->oa_length,
				MAX_AUTH_BYTES);
			return (false);
		}
		buf = xdr_inline_encode(xdrs, 6 * BYTES_PER_XDR_UNIT
						+ RNDUP(oa->oa_length));

		if (buf != NULL) {
			__warnx(TIRPC_DEBUG_FLAG_RPC_MSG,
				"%s:%u ACCEPTED INLINE",
				__func__, __LINE__);
			IXDR_PUT_INT32(buf, dmsg->rm_xid);
			IXDR_PUT_ENUM(buf, dmsg->rm_direction);
			IXDR_PUT_ENUM(buf, dmsg->rm_reply.rp_stat);
			IXDR_PUT_ENUM(buf, oa->oa_flavor);
			IXDR_PUT_INT32(buf, oa->oa_length);
			if (oa->oa_length) {
				memcpy(buf, oa->oa_body, oa->oa_length);
				buf += RNDUP(oa->oa_length) / sizeof(int32_t);
			}

			IXDR_PUT_ENUM(buf, ar->ar_stat);
			switch (ar->ar_stat) {
			case SUCCESS:
				__warnx(TIRPC_DEBUG_FLAG_RPC_MSG,
					"%s:%u SUCCESS",
					__func__, __LINE__);
				return (true);

			case PROG_MISMATCH:
				__warnx(TIRPC_DEBUG_FLAG_RPC_MSG,
					"%s:%u MISMATCH",
					__func__, __LINE__);
				buf = xdr_inline_encode(xdrs,
							2 * BYTES_PER_XDR_UNIT);
				if (buf != NULL) {
					IXDR_PUT_ENUM(buf, ar->ar_vers.low);
					IXDR_PUT_ENUM(buf, ar->ar_vers.high);
				} else if (!xdr_putuint32(xdrs,
							  ar->ar_vers.low)) {
					__warnx(TIRPC_DEBUG_FLAG_ERROR,
						"%s:%u ERROR ar_vers.low %u",
						__func__, __LINE__,
						ar->ar_vers.low);
					return (false);
				} else if (!xdr_putuint32(xdrs,
							  ar->ar_vers.high)) {
					__warnx(TIRPC_DEBUG_FLAG_ERROR,
						"%s:%u ERROR ar_vers.high %u",
						__func__, __LINE__,
						ar->ar_vers.high);
					return (false);
				}
				/* fallthru */
			case GARBAGE_ARGS:
			case SYSTEM_ERR:
			case PROC_UNAVAIL:
			case PROG_UNAVAIL:
				break;
			};
			return (true);
		}

		__warnx(TIRPC_DEBUG_FLAG_RPC_MSG,
			"%s:%u ACCEPTED non-INLINE",
			__func__, __LINE__);
		if (!xdr_putuint32(xdrs, dmsg->rm_xid)) {
			__warnx(TIRPC_DEBUG_FLAG_ERROR,
				"%s:%u ERROR rm_xid %u",
				__func__, __LINE__,
				dmsg->rm_xid);
			return (false);
		}
		if (!xdr_putenum(xdrs, dmsg->rm_direction)) {
			__warnx(TIRPC_DEBUG_FLAG_ERROR,
				"%s:%u ERROR rm_direction %u",
				__func__, __LINE__,
				dmsg->rm_direction);
			return (false);
		}
		if (!inline_xdr_union(xdrs,
				      (enum_t *) &(dmsg->rm_reply.rp_stat),
				      (void *)&(dmsg->rm_reply.ru),
				      reply_dscrm, NULL_xdrproc_t)) {
			__warnx(TIRPC_DEBUG_FLAG_ERROR,
				"%s:%u ERROR inline_xdr_union",
				__func__, __LINE__);
			return (false);
		}
		return (true);
	}
	case MSG_DENIED:
	{
		struct rejected_reply *rr = (struct rejected_reply *)
						&(dmsg->rm_reply.ru);

		buf = xdr_inline_encode(xdrs, 3 * BYTES_PER_XDR_UNIT);
		if (buf != NULL) {
			IXDR_PUT_INT32(buf, dmsg->rm_xid);
			IXDR_PUT_ENUM(buf, dmsg->rm_direction);
			IXDR_PUT_ENUM(buf, dmsg->rm_reply.rp_stat);
		} else if (!xdr_putuint32(xdrs, dmsg->rm_xid)) {
			__warnx(TIRPC_DEBUG_FLAG_ERROR,
				"%s:%u ERROR rm_xid %u",
				__func__, __LINE__,
				dmsg->rm_xid);
			return (false);
		} else if (!xdr_putenum(xdrs, dmsg->rm_direction)) {
			__warnx(TIRPC_DEBUG_FLAG_ERROR,
				"%s:%u ERROR rm_direction %u",
				__func__, __LINE__,
				dmsg->rm_direction);
			return (false);
		} else if (!xdr_putenum(xdrs, dmsg->rm_reply.rp_stat)) {
			__warnx(TIRPC_DEBUG_FLAG_ERROR,
				"%s:%u ERROR rp_stat %u",
				__func__, __LINE__,
				dmsg->rm_reply.rp_stat);
			return (false);
		}

		switch (rr->rj_stat) {
		case RPC_MISMATCH:
			__warnx(TIRPC_DEBUG_FLAG_RPC_MSG,
				"%s:%u DENIED MISMATCH",
				__func__, __LINE__);
			buf = xdr_inline_encode(xdrs, 3 * BYTES_PER_XDR_UNIT);

			if (buf != NULL) {
				IXDR_PUT_ENUM(buf, rr->rj_stat);
				IXDR_PUT_U_INT32(buf, rr->rj_vers.low);
				IXDR_PUT_U_INT32(buf, rr->rj_vers.high);
			} else if (!xdr_putenum(xdrs, rr->rj_stat)) {
				__warnx(TIRPC_DEBUG_FLAG_ERROR,
					"%s:%u ERROR rj_stat %u",
					__func__, __LINE__,
					rr->rj_stat);
				return (false);
			} else if (!xdr_putuint32(xdrs, rr->rj_vers.low)) {
				__warnx(TIRPC_DEBUG_FLAG_ERROR,
					"%s:%u ERROR rj_vers.low %u",
					__func__, __LINE__,
					rr->rj_vers.low);
				return (false);
			} else if (!xdr_putuint32(xdrs, rr->rj_vers.high)) {
				__warnx(TIRPC_DEBUG_FLAG_ERROR,
					"%s:%u ERROR rj_vers.high %u",
					__func__, __LINE__,
					rr->rj_vers.high);
				return (false);
			}
			return (true); /* bugfix */
		case AUTH_ERROR:
			__warnx(TIRPC_DEBUG_FLAG_RPC_MSG,
				"%s:%u DENIED AUTH",
				__func__, __LINE__);
			buf = xdr_inline_encode(xdrs, 2 * BYTES_PER_XDR_UNIT);

			if (buf != NULL) {
				IXDR_PUT_ENUM(buf, rr->rj_stat);
				IXDR_PUT_ENUM(buf, rr->rj_why);
			} else if (!xdr_putenum(xdrs, rr->rj_stat)) {
				__warnx(TIRPC_DEBUG_FLAG_ERROR,
					"%s:%u ERROR rj_stat %u",
					__func__, __LINE__,
					rr->rj_stat);
				return (false);
			} else if (!xdr_putenum(xdrs, rr->rj_why)) {
				__warnx(TIRPC_DEBUG_FLAG_ERROR,
					"%s:%u ERROR rj_why %u",
					__func__, __LINE__,
					rr->rj_why);
				return (false);
			}
			return (true); /* bugfix */
		default:
			__warnx(TIRPC_DEBUG_FLAG_ERROR,
				"%s:%u ERROR rr->rj_stat (%u)",
				__func__, __LINE__,
				rr->rj_stat);
			break;
		};
		break;
	}
	default:
		__warnx(TIRPC_DEBUG_FLAG_ERROR,
			"%s:%u ERROR dmsg->rm_reply.rp_stat (%u)",
			__func__, __LINE__,
			dmsg->rm_reply.rp_stat);
		break;
	};

	return (false);
}